

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midl.c
# Opt level: O3

uint mdb_midl_search(MDB_IDL ids,MDB_ID id)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = (uint)*ids;
  if (uVar3 == 0) {
    return 1;
  }
  uVar4 = 0;
  do {
    uVar5 = uVar3 >> 1;
    uVar2 = uVar4 + uVar5 + 1;
    uVar1 = ids[uVar2];
    if (id <= uVar1) {
      if (uVar1 <= id) {
        return uVar2;
      }
      uVar5 = uVar3 + ~uVar5;
      uVar4 = uVar2;
    }
    uVar3 = uVar5;
  } while (uVar3 != 0);
  return uVar2 + (id < uVar1);
}

Assistant:

unsigned mdb_midl_search( MDB_IDL ids, MDB_ID id )
{
	/*
	 * binary search of id in ids
	 * if found, returns position of id
	 * if not found, returns first position greater than id
	 */
	unsigned base = 0;
	unsigned cursor = 1;
	int val = 0;
	unsigned n = ids[0];

	while( 0 < n ) {
		unsigned pivot = n >> 1;
		cursor = base + pivot + 1;
		val = CMP( ids[cursor], id );

		if( val < 0 ) {
			n = pivot;

		} else if ( val > 0 ) {
			base = cursor;
			n -= pivot + 1;

		} else {
			return cursor;
		}
	}

	if( val > 0 ) {
		++cursor;
	}
	return cursor;
}